

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_state_ptr lzham::lzham_lib_decompress_init(lzham_decompress_params *pParams)

{
  int iVar1;
  uchar *puVar2;
  EVP_PKEY_CTX *in_RSI;
  int *in_RDI;
  lzham_decompressor *pState;
  undefined8 in_stack_fffffffffffffff8;
  uint32 num;
  lzham_decompressor *this;
  
  num = (uint32)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if ((in_RDI == (int *)0x0) || (*in_RDI != 0x10)) {
    this = (lzham_decompressor *)0x0;
  }
  else if (((uint)in_RDI[1] < 0xf) || (0x1d < (uint)in_RDI[1])) {
    this = (lzham_decompressor *)0x0;
  }
  else {
    this = lzham_new<lzham::lzham_decompressor>();
    if (this == (lzham_decompressor *)0x0) {
      this = (lzham_decompressor *)0x0;
    }
    else {
      iVar1 = in_RDI[1];
      (this->m_params).m_struct_size = in_RDI[0];
      (this->m_params).m_dict_size_log2 = iVar1;
      iVar1 = in_RDI[3];
      (this->m_params).m_output_unbuffered = in_RDI[2];
      (this->m_params).m_compute_adler32 = iVar1;
      if ((this->m_params).m_output_unbuffered == 0) {
        puVar2 = lzham_new_array<unsigned_char>(num);
        this->m_pRaw_decomp_buf = puVar2;
        if (this->m_pRaw_decomp_buf == (uint8 *)0x0) {
          lzham_delete<lzham::lzham_decompressor>((lzham_decompressor *)0x124fc7);
          return (lzham_decompress_state_ptr)0x0;
        }
        in_RSI = (EVP_PKEY_CTX *)0x10;
        puVar2 = math::align_up_pointer<unsigned_char*>(this->m_pRaw_decomp_buf,0x10);
        this->m_pDecomp_buf = puVar2;
      }
      else {
        this->m_pRaw_decomp_buf = (uint8 *)0x0;
        this->m_pDecomp_buf = (uint8 *)0x0;
      }
      lzham_decompressor::init(this,in_RSI);
    }
  }
  return this;
}

Assistant:

lzham_decompress_state_ptr lzham_lib_decompress_init(const lzham_decompress_params *pParams)
   {
      LZHAM_ASSUME(CLZDecompBase::cMinDictSizeLog2 == LZHAM_MIN_DICT_SIZE_LOG2);
      LZHAM_ASSUME(CLZDecompBase::cMaxDictSizeLog2 == LZHAM_MAX_DICT_SIZE_LOG2_X64);

      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_decompress_params)))
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZDecompBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZDecompBase::cMaxDictSizeLog2))
         return NULL;

      lzham_decompressor *pState = lzham_new<lzham_decompressor>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;

      if (pState->m_params.m_output_unbuffered)
      {
         pState->m_pRaw_decomp_buf = NULL;
         pState->m_pDecomp_buf = NULL;
      }
      else
      {
         pState->m_pRaw_decomp_buf = lzham_new_array<uint8>(static_cast<uint32>(1U << pState->m_params.m_dict_size_log2) + 15);
         if (!pState->m_pRaw_decomp_buf)
         {
            lzham_delete(pState);
            return NULL;
         }
         pState->m_pDecomp_buf = math::align_up_pointer(pState->m_pRaw_decomp_buf, 16);
      }

      pState->init();

      return pState;
   }